

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawStringProp
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  char cVar1;
  Mode MVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Pixel PVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  int32_t js;
  uint32_t uVar13;
  long lVar14;
  int32_t is;
  uint32_t uVar15;
  int iVar16;
  
  MVar2 = this->nPixelMode;
  if (MVar2 != CUSTOM) {
    this->nPixelMode = ((uint)col.field_0 < 0xff000000) + MASK;
  }
  if (sText->_M_string_length != 0) {
    pcVar9 = (sText->_M_dataplus)._M_p;
    pcVar12 = pcVar9 + sText->_M_string_length;
    iVar7 = 0;
    iVar3 = 0;
    do {
      cVar1 = *pcVar9;
      lVar14 = (long)cVar1;
      if (lVar14 == 10) {
        iVar3 = iVar3 + scale * 8;
        iVar7 = 0;
      }
      else {
        uVar10 = (int)cVar1 - 0x20;
        uVar4 = (int)cVar1 - 0x11;
        if (-1 < (int)uVar10) {
          uVar4 = uVar10;
        }
        iVar5 = ((int)cVar1 - (uVar4 & 0xfffffff0)) + -0x20;
        if (scale < 2) {
          if (0 < (this->vFontSpacing).
                  super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].y) {
            iVar8 = 0;
            do {
              iVar16 = 0;
              do {
                PVar6 = Sprite::GetPixel(this->fontSprite,
                                         (this->vFontSpacing).
                                         super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].x
                                         + iVar8 + iVar5 * 8,((int)uVar4 >> 4) * 8 + iVar16);
                if (PVar6.field_0._0_1_ != '\0') {
                  (*this->_vptr_PixelGameEngine[5])
                            (this,(ulong)(uint)(x + iVar7 + iVar8),(ulong)(uint)(y + iVar3 + iVar16)
                             ,(ulong)(uint)col.field_0);
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != 8);
              iVar8 = iVar8 + 1;
            } while (iVar8 < (this->vFontSpacing).
                             super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].y);
          }
        }
        else if (0 < (this->vFontSpacing).
                     super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].y) {
          iVar8 = 0;
          do {
            iVar11 = 0;
            iVar16 = y + iVar3;
            do {
              PVar6 = Sprite::GetPixel(this->fontSprite,
                                       (this->vFontSpacing).
                                       super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].x +
                                       iVar5 * 8 + iVar8,iVar11 + ((int)uVar4 >> 4) * 8);
              if (PVar6.field_0._0_1_ != '\0' && 0 < (int)scale) {
                uVar15 = 0;
                do {
                  uVar13 = 0;
                  do {
                    (*this->_vptr_PixelGameEngine[5])
                              (this,(ulong)(iVar8 * scale + x + iVar7 + uVar15),
                               (ulong)(iVar16 + uVar13),(ulong)(uint)col.field_0);
                    uVar13 = uVar13 + 1;
                  } while (scale != uVar13);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != scale);
              }
              iVar11 = iVar11 + 1;
              iVar16 = iVar16 + scale;
            } while (iVar11 != 8);
            iVar8 = iVar8 + 1;
          } while (iVar8 < (this->vFontSpacing).
                           super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].y);
        }
        iVar7 = (this->vFontSpacing).
                super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar10].y * scale + iVar7;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar12);
  }
  this->nPixelMode = MVar2;
  return;
}

Assistant:

void PixelGameEngine::DrawStringProp(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;

		if (m != Pixel::CUSTOM)
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (int32_t i = 0; i < vFontSpacing[c - 32].y; i++)
						for (int32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8 + vFontSpacing[c - 32].x, j + oy * 8).r > 0)
								for (int32_t is = 0; is < int(scale); is++)
									for (int32_t js = 0; js < int(scale); js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (int32_t i = 0; i < vFontSpacing[c - 32].y; i++)
						for (int32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8 + vFontSpacing[c - 32].x, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += vFontSpacing[c - 32].y * scale;
			}
		}
		SetPixelMode(m);
	}